

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlSaveFormatFileTo(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int format;
  PyObject *pyobj_buf;
  char *encoding;
  PyObject *pyobj_cur;
  undefined4 local_24;
  undefined *local_20;
  undefined8 local_18;
  undefined *local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOzi:xmlSaveFormatFileTo",&local_20,&local_10,&local_18,&local_24);
  if (iVar1 != 0) {
    if (local_20 == &_Py_NoneStruct) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined8 *)(local_20 + 0x10);
    }
    if (local_10 == &_Py_NoneStruct) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)(local_10 + 0x10);
    }
    iVar1 = xmlSaveFormatFileTo(uVar4,uVar3,local_18,local_24);
    *(undefined8 *)(local_20 + 0x10) = 0;
    pPVar2 = libxml_intWrap(iVar1);
  }
  return pPVar2;
}

Assistant:

static PyObject *
libxml_xmlSaveFormatFileTo(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlOutputBufferPtr buf;
    PyObject *pyobj_buf;
    xmlDocPtr cur;
    PyObject *pyobj_cur;
    char * encoding;
    int format;

    if (!PyArg_ParseTuple(args, (char *)"OOzi:xmlSaveFormatFileTo", &pyobj_buf, &pyobj_cur, &encoding, &format))
        return(NULL);
    buf = (xmlOutputBufferPtr) PyoutputBuffer_Get(pyobj_buf);
    cur = (xmlDocPtr) PyxmlNode_Get(pyobj_cur);

    c_retval = xmlSaveFormatFileTo(buf, cur, encoding, format);
	/* xmlSaveFormatFileTo() freed the memory pointed to by buf, so record that
	 * in the Python object */
	((PyoutputBuffer_Object *)(pyobj_buf))->obj = NULL;
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}